

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O0

void Ivy_CutPrintForNode(Ivy_Cut_t *pCut)

{
  int local_14;
  int i;
  Ivy_Cut_t *pCut_local;
  
  if (0 < pCut->nSize) {
    printf("%d : {",(ulong)(uint)(int)pCut->nSize);
    for (local_14 = 0; local_14 < pCut->nSize; local_14 = local_14 + 1) {
      printf(" %d",(ulong)(uint)pCut->pArray[local_14]);
    }
    printf(" }\n");
    return;
  }
  __assert_fail("pCut->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivySeq.c"
                ,0x3c7,"void Ivy_CutPrintForNode(Ivy_Cut_t *)");
}

Assistant:

void Ivy_CutPrintForNode( Ivy_Cut_t * pCut )
{
    int i;
    assert( pCut->nSize > 0 );
    printf( "%d : {", pCut->nSize );
    for ( i = 0; i < pCut->nSize; i++ )
        printf( " %d", pCut->pArray[i] );
    printf( " }\n" );
}